

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeemitter.cpp
# Opt level: O0

Error __thiscall asmjit::CodeEmitter::onDetach(CodeEmitter *this,CodeHolder *code)

{
  CodeHolder *code_local;
  CodeEmitter *this_local;
  
  (this->_codeInfo)._archInfo.field_0._signature = 0;
  (this->_codeInfo).field_1.field_0._stackAlignment = '\0';
  (this->_codeInfo).field_1.field_0._cdeclCallConv = '\0';
  (this->_codeInfo).field_1.field_0._stdCallConv = '\0';
  (this->_codeInfo).field_1.field_0._fastCallConv = '\0';
  (this->_codeInfo)._baseAddress = 0xffffffffffffffff;
  this->_finalized = '\0';
  this->_lastError = 6;
  this->_privateData = 0;
  this->_globalHints = 0;
  this->_globalOptions = 1;
  this->_options = 0;
  (this->_extraReg)._signature = 0;
  (this->_extraReg)._id = 0;
  this->_inlineComment = (char *)0x0;
  (this->_nativeGpReg).super_Operand.super_Operand_.field_0._packed[0] = (UInt64)0x0;
  (this->_nativeGpReg).super_Operand.super_Operand_.field_0._mem.field_2.offset64 = 0;
  this->_nativeGpArray = (Reg *)0x0;
  return 0;
}

Assistant:

Error CodeEmitter::onDetach(CodeHolder* code) noexcept {
  _codeInfo.reset();
  _finalized = false;
  _lastError = kErrorNotInitialized;

  _privateData = 0;
  _globalHints = 0;
  _globalOptions = kOptionMaybeFailureCase;

  _options = 0;
  _extraReg.reset();
  _inlineComment = nullptr;

  _nativeGpReg.reset();
  _nativeGpArray = nullptr;

  return kErrorOk;
}